

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::internal::
ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>::
Impl<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
::Impl(Impl<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
       *this,shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
             *value)

{
  _Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_28;
  
  (this->
  super_ActionInterface<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  )._vptr_ActionInterface = (_func_int **)&PTR__Impl_002eefd0;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&this->value_before_cast_,
             (value->
             super___shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_28,
             &this->value_before_cast_);
  (this->value_).super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
  ._M_impl.super__Vector_impl_data._M_start = local_28._M_impl.super__Vector_impl_data._M_start;
  (this->value_).super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_28._M_impl.super__Vector_impl_data._M_finish;
  (this->value_).super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_28._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            (&local_28);
  return;
}

Assistant:

explicit Impl(const std::shared_ptr<R>& value)
        : value_before_cast_(*value),
          value_(ImplicitCast_<Result>(value_before_cast_)) {}